

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O2

void kf_work(kiss_fft_cpx *Fout,kiss_fft_cpx *f,size_t fstride,int in_stride,int *factors,
            kiss_fft_cfg st)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  float *__ptr;
  long lVar6;
  long lVar7;
  ulong uVar8;
  kiss_fft_cpx *pkVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  kiss_fft_cpx *pkVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  float fVar19;
  kiss_fft_cpx kVar20;
  kiss_fft_cpx kVar21;
  kiss_fft_cpx kVar22;
  kiss_fft_cpx kVar23;
  float fVar24;
  float fVar25;
  kiss_fft_cpx kVar26;
  kiss_fft_cpx kVar27;
  float fVar28;
  kiss_fft_cpx kVar29;
  kiss_fft_cpx kVar30;
  kiss_fft_cpx kVar31;
  kiss_fft_cpx kVar32;
  float fVar33;
  float fVar35;
  kiss_fft_cpx kVar34;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  int local_50;
  
  uVar3 = *factors;
  uVar4 = factors[1];
  lVar6 = (long)(int)uVar4;
  if (lVar6 == 1) {
    lVar7 = 0;
    do {
      *(kiss_fft_cpx *)((long)&Fout->r + lVar7) = *f;
      f = f + (long)in_stride * fstride;
      lVar7 = lVar7 + 8;
    } while ((long)(int)(uVar4 * uVar3) * 8 != lVar7);
  }
  else {
    lVar7 = 0;
    do {
      kf_work((kiss_fft_cpx *)((long)&Fout->r + lVar7),f,(long)(int)uVar3 * fstride,in_stride,
              factors + 2,st);
      f = f + (long)in_stride * fstride;
      lVar7 = lVar7 + lVar6 * 8;
    } while ((long)(int)(uVar4 * uVar3) * 8 != lVar7);
  }
  switch(uVar3) {
  case 2:
    pkVar9 = st->twiddles;
    lVar7 = 0;
    do {
      fVar24 = (*pkVar9).r;
      fVar25 = (*pkVar9).i;
      fVar19 = Fout[lVar6 + lVar7].r * fVar24 + fVar25 * -Fout[lVar6 + lVar7].i;
      fVar24 = Fout[lVar6 + lVar7].r * fVar25 + fVar24 * Fout[lVar6 + lVar7].i;
      kVar26.r = Fout[lVar7].r - fVar19;
      kVar26.i = Fout[lVar7].i - fVar24;
      Fout[lVar6 + lVar7] = kVar26;
      kVar27.r = Fout[lVar7].r + fVar19;
      kVar27.i = Fout[lVar7].i + fVar24;
      Fout[lVar7] = kVar27;
      lVar7 = lVar7 + 1;
      pkVar9 = pkVar9 + fstride;
    } while (uVar4 != (uint)lVar7);
    break;
  case 3:
    fVar19 = st->twiddles[lVar6 * fstride].i;
    lVar11 = 0;
    lVar7 = lVar6;
    do {
      uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar11);
      fVar24 = (float)uVar1;
      fVar25 = (float)((ulong)uVar1 >> 0x20);
      fVar28 = Fout[lVar6].r * fVar25 + Fout[lVar6].i * fVar24;
      fVar44 = Fout[lVar6].r * fVar24 + -Fout[lVar6].i * fVar25;
      uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar11 * 2);
      fVar25 = (float)uVar1;
      fVar39 = (float)((ulong)uVar1 >> 0x20);
      fVar24 = Fout[lVar6 * 2].r * fVar39 + Fout[lVar6 * 2].i * fVar25;
      fVar25 = Fout[lVar6 * 2].r * fVar25 + -Fout[lVar6 * 2].i * fVar39;
      fVar39 = (fVar28 - fVar24) * fVar19;
      fVar37 = (fVar44 - fVar25) * fVar19;
      fVar24 = fVar24 + fVar28;
      fVar25 = fVar25 + fVar44;
      kVar31.i = fVar24 * -0.5 + (*Fout).i;
      kVar31.r = fVar25 * -0.5 + (*Fout).r;
      Fout[lVar6] = kVar31;
      kVar32.r = (*Fout).r + fVar25;
      kVar32.i = (*Fout).i + fVar24;
      *Fout = kVar32;
      kVar29.i = Fout[lVar6].i - fVar37;
      kVar29.r = Fout[lVar6].r + fVar39;
      Fout[lVar6 * 2] = kVar29;
      kVar34.i = fVar37 + Fout[lVar6].i;
      kVar34.r = Fout[lVar6].r - fVar39;
      Fout[lVar6] = kVar34;
      Fout = Fout + 1;
      lVar11 = lVar11 + fstride * 8;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    break;
  case 4:
    iVar5 = st->inverse;
    pkVar13 = st->twiddles;
    lVar7 = 0;
    lVar11 = 0;
    pkVar9 = pkVar13;
    do {
      uVar1 = *(undefined8 *)((long)&pkVar13->r + lVar11);
      fVar19 = (float)uVar1;
      fVar24 = (float)((ulong)uVar1 >> 0x20);
      fVar25 = Fout[lVar6 + lVar7].r * fVar24 + Fout[lVar6 + lVar7].i * fVar19;
      fVar28 = Fout[lVar6 + lVar7].r * fVar19 + -Fout[lVar6 + lVar7].i * fVar24;
      uVar1 = *(undefined8 *)((long)&pkVar13->r + lVar11 * 2);
      fVar24 = (float)uVar1;
      fVar44 = (float)((ulong)uVar1 >> 0x20);
      fVar19 = Fout[lVar6 * 2 + lVar7].r * fVar24 + fVar44 * -Fout[lVar6 * 2 + lVar7].i;
      fVar24 = Fout[lVar6 * 2 + lVar7].r * fVar44 + fVar24 * Fout[lVar6 * 2 + lVar7].i;
      fVar39 = (*pkVar9).r;
      fVar37 = (*pkVar9).i;
      fVar44 = Fout[lVar6 * 3 + lVar7].r * fVar37 + Fout[lVar6 * 3 + lVar7].i * fVar39;
      fVar39 = Fout[lVar6 * 3 + lVar7].r * fVar39 + -Fout[lVar6 * 3 + lVar7].i * fVar37;
      fVar40 = Fout[lVar7].r;
      fVar42 = Fout[lVar7].i;
      fVar37 = fVar40 - fVar19;
      fVar38 = fVar42 - fVar24;
      kVar20.r = fVar19 + fVar40;
      kVar20.i = fVar24 + fVar42;
      Fout[lVar7] = kVar20;
      fVar40 = fVar25 - fVar44;
      fVar42 = fVar28 - fVar39;
      fVar44 = fVar44 + fVar25;
      fVar39 = fVar39 + fVar28;
      kVar21.r = kVar20.r - fVar39;
      kVar21.i = kVar20.i - fVar44;
      Fout[lVar6 * 2 + lVar7] = kVar21;
      kVar22.r = Fout[lVar7].r + fVar39;
      kVar22.i = Fout[lVar7].i + fVar44;
      Fout[lVar7] = kVar22;
      fVar19 = fVar37 + fVar40;
      fVar24 = fVar38 + fVar42;
      kVar30.r = fVar37 - fVar40;
      kVar30.i = fVar38 - fVar42;
      if (iVar5 == 0) {
        kVar23.i = kVar30.i;
        kVar23.r = fVar19;
        kVar30.i = fVar24;
      }
      else {
        kVar23.i = fVar24;
        kVar23.r = kVar30.r;
        kVar30.r = fVar19;
      }
      pkVar9 = pkVar9 + fstride * 3;
      Fout[lVar6 + lVar7] = kVar23;
      Fout[lVar6 * 3 + lVar7] = kVar30;
      lVar11 = lVar11 + fstride * 8;
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
    break;
  case 5:
    lVar7 = lVar6 * fstride;
    fVar19 = st->twiddles[lVar7].r;
    fVar24 = st->twiddles[lVar7].i;
    lVar11 = 0;
    uVar8 = 0;
    if (0 < (int)uVar4) {
      uVar8 = (ulong)uVar4;
    }
    fVar25 = st->twiddles[lVar7 * 2].r;
    fVar28 = st->twiddles[lVar7 * 2].i;
    lVar7 = 0;
    lVar18 = 0;
    for (; uVar8 * 8 != lVar11; lVar11 = lVar11 + 8) {
      fVar44 = *(float *)((long)&Fout[lVar6].r + lVar11);
      fVar39 = *(float *)((long)&Fout[lVar6].i + lVar11);
      fVar37 = *(float *)((long)&Fout[(int)(uVar4 * 2)].r + lVar11);
      fVar38 = *(float *)((long)&Fout[(int)(uVar4 * 2)].i + lVar11);
      fVar40 = *(float *)((long)&Fout[(int)(uVar4 * 3)].r + lVar11);
      fVar42 = *(float *)((long)&Fout[(int)(uVar4 * 3)].i + lVar11);
      uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar18);
      fVar35 = (float)uVar1;
      fVar36 = (float)((ulong)uVar1 >> 0x20);
      fVar33 = fVar44 * fVar35 + fVar36 * -fVar39;
      fVar35 = fVar44 * fVar36 + fVar35 * fVar39;
      fVar44 = *(float *)((long)&Fout[(int)(uVar4 * 4)].r + lVar11);
      uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar18 * 2);
      fVar41 = (float)uVar1;
      fVar43 = (float)((ulong)uVar1 >> 0x20);
      fVar39 = *(float *)((long)&Fout[(int)(uVar4 * 4)].i + lVar11);
      fVar36 = fVar37 * fVar41 + fVar43 * -fVar38;
      fVar37 = fVar37 * fVar43 + fVar41 * fVar38;
      uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar7);
      fVar41 = (float)uVar1;
      fVar43 = (float)((ulong)uVar1 >> 0x20);
      uVar1 = *(undefined8 *)((long)&Fout->r + lVar11);
      fVar38 = fVar40 * fVar41 + fVar43 * -fVar42;
      fVar40 = fVar40 * fVar43 + fVar41 * fVar42;
      uVar2 = *(undefined8 *)(&st->twiddles[0].r + lVar18);
      fVar42 = (float)uVar2;
      fVar41 = (float)((ulong)uVar2 >> 0x20);
      fVar43 = fVar44 * fVar42 + fVar41 * -fVar39;
      fVar44 = fVar44 * fVar41 + fVar42 * fVar39;
      fVar45 = fVar33 + fVar43;
      fVar46 = fVar35 + fVar44;
      fVar33 = fVar33 - fVar43;
      fVar35 = fVar35 - fVar44;
      fVar44 = fVar36 + fVar38;
      fVar42 = fVar37 + fVar40;
      fVar37 = fVar37 - fVar40;
      fVar40 = (float)uVar1;
      fVar41 = (float)((ulong)uVar1 >> 0x20);
      *(ulong *)((long)&Fout->r + lVar11) =
           CONCAT44(fVar42 + fVar46 + fVar41,fVar44 + fVar45 + fVar40);
      fVar43 = fVar44 * fVar25 + fVar45 * fVar19 + fVar40;
      fVar47 = fVar42 * fVar25 + fVar46 * fVar19 + fVar41;
      fVar39 = -(fVar36 - fVar38);
      fVar38 = fVar35 * fVar24 + fVar28 * fVar37;
      fVar36 = -fVar33 * fVar24 + fVar28 * fVar39;
      *(ulong *)((long)&Fout[lVar6].r + lVar11) = CONCAT44(fVar47 - fVar36,fVar43 - fVar38);
      *(ulong *)((long)&Fout[(int)(uVar4 * 4)].r + lVar11) =
           CONCAT44(fVar36 + fVar47,fVar38 + fVar43);
      fVar38 = fVar44 * fVar19 + fVar45 * fVar25 + fVar40;
      fVar40 = fVar42 * fVar19 + fVar46 * fVar25 + fVar41;
      fVar44 = -fVar35 * fVar28 + fVar37 * fVar24;
      fVar39 = fVar33 * fVar28 + fVar39 * fVar24;
      *(float *)((long)&Fout[(int)(uVar4 * 2)].r + lVar11) = fVar44 + fVar38;
      *(float *)((long)&Fout[(int)(uVar4 * 2)].i + lVar11) = fVar39 + fVar40;
      *(ulong *)((long)&Fout[(int)(uVar4 * 3)].r + lVar11) =
           CONCAT44(fVar40 - fVar39,fVar38 - fVar44);
      lVar18 = lVar18 + fstride * 8;
      lVar7 = lVar7 + fstride * 0x18;
    }
    break;
  default:
    iVar5 = st->nfft;
    __ptr = (float *)malloc((long)(int)uVar3 << 3);
    uVar8 = 0;
    if (0 < (int)uVar3) {
      uVar8 = (ulong)uVar3;
    }
    uVar12 = 0;
    if (0 < (int)uVar4) {
      uVar12 = (ulong)uVar4;
    }
    pkVar9 = Fout;
    for (uVar16 = 0; uVar16 != uVar12; uVar16 = uVar16 + 1) {
      pkVar13 = pkVar9;
      for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
        *(kiss_fft_cpx *)(__ptr + uVar15 * 2) = *pkVar13;
        pkVar13 = pkVar13 + lVar6;
      }
      uVar15 = uVar16;
      for (iVar17 = 0; iVar17 != (int)uVar8; iVar17 = iVar17 + 1) {
        fVar19 = *__ptr;
        fVar24 = __ptr[1];
        Fout[uVar15].r = fVar19;
        Fout[uVar15].i = fVar24;
        local_50 = (int)fstride;
        iVar14 = 0;
        for (lVar7 = 0; (ulong)uVar3 - 1 != lVar7; lVar7 = lVar7 + 1) {
          iVar14 = iVar14 + (int)uVar15 * local_50;
          iVar10 = iVar5;
          if (iVar14 < iVar5) {
            iVar10 = 0;
          }
          iVar14 = iVar14 - iVar10;
          fVar25 = st->twiddles[iVar14].r;
          fVar28 = st->twiddles[iVar14].i;
          fVar19 = fVar19 + __ptr[lVar7 * 2 + 2] * fVar25 + fVar28 * -__ptr[lVar7 * 2 + 3];
          fVar24 = fVar24 + __ptr[lVar7 * 2 + 2] * fVar28 + fVar25 * __ptr[lVar7 * 2 + 3];
          Fout[uVar15].r = fVar19;
          Fout[uVar15].i = fVar24;
        }
        uVar15 = uVar15 + lVar6;
      }
      pkVar9 = pkVar9 + 1;
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

static
void kf_work(
        kiss_fft_cpx * Fout,
        const kiss_fft_cpx * f,
        const size_t fstride,
        int in_stride,
        int * factors,
        const kiss_fft_cfg st
        )
{
    kiss_fft_cpx * Fout_beg=Fout;
    const int p=*factors++; /* the radix  */
    const int m=*factors++; /* stage's fft length/p */
    const kiss_fft_cpx * Fout_end = Fout + p*m;

#ifdef _OPENMP
    // use openmp extensions at the 
    // top-level (not recursive)
    if (fstride==1 && p<=5)
    {
        int k;

        // execute the p different work units in different threads
#       pragma omp parallel for
        for (k=0;k<p;++k) 
            kf_work( Fout +k*m, f+ fstride*in_stride*k,fstride*p,in_stride,factors,st);
        // all threads have joined by this point

        switch (p) {
            case 2: kf_bfly2(Fout,fstride,st,m); break;
            case 3: kf_bfly3(Fout,fstride,st,m); break; 
            case 4: kf_bfly4(Fout,fstride,st,m); break;
            case 5: kf_bfly5(Fout,fstride,st,m); break; 
            default: kf_bfly_generic(Fout,fstride,st,m,p); break;
        }
        return;
    }
#endif

    if (m==1) {
        do{
            *Fout = *f;
            f += fstride*in_stride;
        }while(++Fout != Fout_end );
    }else{
        do{
            // recursive call:
            // DFT of size m*p performed by doing
            // p instances of smaller DFTs of size m, 
            // each one takes a decimated version of the input
            kf_work( Fout , f, fstride*p, in_stride, factors,st);
            f += fstride*in_stride;
        }while( (Fout += m) != Fout_end );
    }

    Fout=Fout_beg;

    // recombine the p smaller DFTs 
    switch (p) {
        case 2: kf_bfly2(Fout,fstride,st,m); break;
        case 3: kf_bfly3(Fout,fstride,st,m); break; 
        case 4: kf_bfly4(Fout,fstride,st,m); break;
        case 5: kf_bfly5(Fout,fstride,st,m); break; 
        default: kf_bfly_generic(Fout,fstride,st,m,p); break;
    }
}